

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall StringInstance::StringInstance(StringInstance *this,string *value)

{
  bool bVar1;
  undefined8 *puVar2;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&sStack_58,"String",(allocator *)&local_38);
  Instance::Instance(&this->super_Instance,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__StringInstance_0017bee0;
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  (this->_value)._M_string_length = 0;
  (this->_value).field_2._M_local_buf[0] = '\0';
  bVar1 = Grammar::is_string_value(value);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)value);
    str_utils::unescape(&sStack_58,&local_38,'\"');
    std::__cxx11::string::operator=((string *)&this->_value,(string *)&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

StringInstance::StringInstance(const std::string& value) : Instance("String") {
    if (!Grammar::is_string_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = str_utils::unescape(value.substr(1, int(value.size()) - 2), '"');
}